

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O3

bool __thiscall ON_SubDQuadNeighborhood::IsValid(ON_SubDQuadNeighborhood *this)

{
  ON_SubDVertexTag OVar1;
  ON_SubDFace *this_00;
  ON_SubDFace *this_01;
  ON_SubDVertex *this_02;
  ON_SubDFace *pOVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint i;
  ON_SubDVertex *pOVar6;
  ON__UINT_PTR OVar7;
  ON_SubDFace *pOVar8;
  ON_SubDEdge *pOVar9;
  ON__UINT_PTR OVar10;
  ON_SubDEdge *pOVar11;
  long lVar12;
  ON_SubDFace *pOVar13;
  uint uVar14;
  uint fi;
  long lVar15;
  int iVar16;
  uint uVar17;
  ON_SubDEdge *(*papOVar18) [2];
  ON_SubDFace *(*papOVar19) [3];
  int iVar20;
  undefined1 auVar21 [16];
  uint side_fei [3];
  ON_SubDEdgePtr side_face_eptr;
  ON_SubDVertex *quad_vertex [4];
  ON_2dex grid_quad_vertex_dex [4];
  ON_SubDEdge *quad_edge [4];
  ON_SubDEdgePtr quad_eptr [4];
  ON_2dex grid_corner_dex [4];
  ON_2dex face_side_dex [4];
  ON_2dex face_corner_dex [4];
  ON_2dex grid_side_dex [4] [2];
  undefined8 local_180;
  uint local_178;
  ON_SubDFace *(*local_170) [3];
  ON_SubDEdge *local_168;
  ON_SubDEdgePtr local_160;
  ON_SubDVertex *local_158 [4];
  ON_2dex local_138;
  ON_2dex local_130;
  ON_2dex local_128;
  ON_2dex local_120;
  ON_SubDEdge *local_118 [4];
  ON_SubDEdgePtr local_f8 [4];
  ON_2dex local_d8;
  ON_2dex local_d0;
  ON_2dex local_c8;
  ON_2dex local_c0;
  ON_2dex local_b8;
  ON_2dex local_b0;
  ON_2dex local_a8;
  ON_2dex local_a0;
  ON_2dex local_98;
  ON_2dex local_90;
  ON_2dex local_88;
  ON_2dex local_80;
  ON_2dex local_78;
  ON_2dex local_70;
  ON_2dex local_68;
  ON_2dex local_60;
  ON_2dex local_58;
  ON_2dex local_50;
  ON_2dex local_48;
  ON_2dex local_40 [2];
  
  auVar21 = psadbw((undefined1  [16])0x0,ZEXT416(*(uint *)this->m_bExtraordinaryCornerVertex));
  if (auVar21._0_4_ == (uint)this->m_extraordinary_corner_vertex_count) {
    uVar5 = 0;
    lVar12 = -4;
    do {
      if (this->m_bBoundaryCrease[lVar12 + -1] == true) {
        if (this->m_bExactQuadrantPatch[lVar12 + -1] == true) goto LAB_00617452;
        uVar5 = uVar5 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
    if ((((uVar5 == this->m_exact_quadrant_patch_count) &&
         (auVar21 = psadbw((undefined1  [16])0x0,ZEXT416(*(uint *)this->m_bBoundaryCrease)),
         auVar21._0_4_ == (uint)this->m_boundary_crease_count)) &&
        (this_00 = this->m_face_grid[1][1], this_00 != (ON_SubDFace *)0x0)) &&
       (this_00->m_edge_count == 4)) {
      lVar12 = 0;
      do {
        uVar5 = (uint)lVar12;
        pOVar6 = ON_SubDFace::Vertex(this_00,uVar5);
        if (pOVar6 == (ON_SubDVertex *)0x0) break;
        if (this->m_vertex_grid[1][1] == pOVar6) {
          pOVar6 = ON_SubDFace::Vertex(this_00,uVar5 + 1 & 3);
          if (pOVar6 == (ON_SubDVertex *)0x0) break;
          if (this->m_vertex_grid[2][1] == pOVar6) {
            iVar16 = 1;
          }
          else {
            if (this->m_vertex_grid[1][2] != pOVar6) break;
            iVar16 = -1;
          }
          lVar15 = 0;
          local_170 = this->m_face_grid;
          ON_2dex::ON_2dex(&local_98,0,0);
          ON_2dex::ON_2dex(&local_90,2,0);
          ON_2dex::ON_2dex(&local_88,2,2);
          ON_2dex::ON_2dex(&local_80,0,2);
          ON_2dex::ON_2dex(&local_b8,1,0);
          ON_2dex::ON_2dex(&local_b0,2,1);
          ON_2dex::ON_2dex(&local_a8,1,2);
          ON_2dex::ON_2dex(&local_a0,0,1);
          ON_2dex::ON_2dex(&local_138,1,1);
          ON_2dex::ON_2dex(&local_130,2,1);
          ON_2dex::ON_2dex(&local_128,2,2);
          ON_2dex::ON_2dex(&local_120,1,2);
          ON_2dex::ON_2dex(&local_d8,0,0);
          ON_2dex::ON_2dex(&local_d0,3,0);
          ON_2dex::ON_2dex(&local_c8,3,3);
          ON_2dex::ON_2dex(&local_c0,0,3);
          ON_2dex::ON_2dex(&local_78,1,0);
          ON_2dex::ON_2dex(&local_70,2,0);
          ON_2dex::ON_2dex(&local_68,3,1);
          ON_2dex::ON_2dex(&local_60,3,2);
          ON_2dex::ON_2dex(&local_58,2,3);
          ON_2dex::ON_2dex(&local_50,1,3);
          ON_2dex::ON_2dex(&local_48,0,2);
          ON_2dex::ON_2dex(local_40,0,1);
          i = uVar5 + iVar16 & 3;
          uVar14 = uVar5 + iVar16 * 2 + 4;
          uVar17 = uVar5 + iVar16 * 2 + 7;
          if (-1 < (int)uVar14) {
            uVar17 = uVar14;
          }
          uVar14 = uVar14 - (uVar17 & 0xfffffffc);
          uVar17 = uVar5 - iVar16 & 3;
          local_158[0] = ON_SubDFace::Vertex(this_00,uVar5);
          local_158[1] = ON_SubDFace::Vertex(this_00,i);
          local_158[2] = ON_SubDFace::Vertex(this_00,uVar14);
          local_158[3] = ON_SubDFace::Vertex(this_00,uVar17);
          local_f8[0].m_ptr = this_00->m_edge4[lVar12].m_ptr;
          local_f8[1].m_ptr = this_00->m_edge4[i].m_ptr;
          local_f8[2].m_ptr = this_00->m_edge4[(int)uVar14].m_ptr;
          local_f8[3].m_ptr = this_00->m_edge4[uVar17].m_ptr;
          local_118[0] = ON_SubDEdgePtr::Edge(local_f8);
          local_118[1] = ON_SubDEdgePtr::Edge(local_f8 + 1);
          local_118[2] = ON_SubDEdgePtr::Edge(local_f8 + 2);
          local_118[3] = ON_SubDEdgePtr::Edge(local_f8 + 3);
          uVar5 = 1;
          goto LAB_00617797;
        }
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 4);
    }
  }
  goto LAB_00617452;
LAB_0061788b:
  papOVar19 = local_170;
  pOVar6 = local_158[lVar12];
  if ((pOVar6 != this->m_vertex_grid[(&local_138)[lVar12].i][(&local_138)[lVar12].j]) ||
     (this_01 = local_170[(&local_b8)[lVar12].i][(&local_b8)[lVar12].j], this_00 == this_01))
  goto LAB_00617452;
  if (this->m_bBoundaryCrease[lVar12] == true) {
    pOVar11 = local_118[lVar12];
    bVar3 = ON_SubDEdge::IsCrease(pOVar11);
    if ((((!bVar3) || (uVar5 = ON_SubDEdge::FaceArrayIndex(pOVar11,this_00), uVar5 == 0xffffffff))
        || ((pOVar11->m_face_count == 2 &&
            ((bVar3 = ON_SubDVertex::IsCreaseOrCorner(pOVar11->m_vertex[0]), !bVar3 ||
             (bVar3 = ON_SubDVertex::IsCreaseOrCorner(pOVar11->m_vertex[1]), !bVar3)))))) ||
       (this_01 != (ON_SubDFace *)0x0)) goto LAB_00617452;
  }
  else {
    if ((this_01 == (ON_SubDFace *)0x0) || (pOVar11 = local_118[lVar12], pOVar11->m_face_count != 2)
       ) goto LAB_00617452;
    local_168 = pOVar11;
    bVar3 = ON_SubDEdge::IsCrease(pOVar11);
    pOVar11 = local_168;
    if (bVar3) {
      OVar1 = local_168->m_vertex[0]->m_vertex_tag;
      if (OVar1 == Dart) {
        iVar20 = 0;
        iVar16 = 2;
      }
      else {
        bVar3 = ON_SubDVertex::IsCreaseOrCorner(local_168->m_vertex[0]);
        iVar16 = 1;
        iVar20 = 1;
        if (!bVar3) goto LAB_00617452;
      }
      this_02 = pOVar11->m_vertex[1];
      if (this_02->m_vertex_tag != Dart) {
        bVar3 = ON_SubDVertex::IsCreaseOrCorner(this_02);
        if ((!bVar3) || (OVar1 != Dart)) goto LAB_00617452;
        iVar20 = iVar20 + 1;
        iVar16 = 1;
      }
      if (iVar20 + iVar16 != 2) goto LAB_00617452;
    }
    else {
      bVar3 = ON_SubDEdge::IsSmooth(local_168);
      pOVar11 = local_168;
      if (!bVar3) goto LAB_00617452;
    }
    pOVar8 = (ON_SubDFace *)(pOVar11->m_face2[0].m_ptr & 0xfffffffffffffff8);
    pOVar13 = (ON_SubDFace *)(pOVar11->m_face2[1].m_ptr & 0xfffffffffffffff8);
    pOVar2 = pOVar13;
    if ((((this_00 != pOVar8) && (pOVar2 = pOVar8, this_00 != pOVar13)) || (this_01 != pOVar2)) ||
       ((this->m_edge_grid[lVar12][0] == (ON_SubDEdge *)0x0 ||
        (papOVar18 = this->m_edge_grid + lVar12, (*papOVar18)[1] == (ON_SubDEdge *)0x0))))
    goto LAB_00617452;
    local_178 = 0;
    local_180 = 0;
    uVar5 = ON_SubDFace::EdgeArrayIndex(this_01,pOVar11);
    local_180 = CONCAT44(uVar5,(uint)local_180);
    if (uVar5 == 0xffffffff) goto LAB_00617452;
    local_160 = ON_SubDFace::EdgePtr(this_01,uVar5);
    pOVar9 = ON_SubDEdgePtr::Edge(&local_160);
    if (pOVar11 != pOVar9) goto LAB_00617452;
    OVar7 = ON_SubDEdgePtr::EdgeDirection(&local_160);
    OVar10 = ON_SubDEdgePtr::EdgeDirection(local_f8 + lVar12);
    uVar17 = (uint)this_01->m_edge_count;
    *(uint *)((long)&local_180 + (ulong)((uint)(OVar7 == OVar10) << 3 ^ 8)) =
         ((uVar5 + uVar17) - 1) % uVar17;
    *(uint *)(&local_180 + (OVar7 == OVar10)) = (local_180._4_4_ + 1U) % uVar17;
    pOVar11 = (*papOVar18)[0];
    pOVar9 = ON_SubDFace::Edge(this_01,(uint)local_180);
    if ((pOVar11 != pOVar9) ||
       (pOVar11 = (*papOVar18)[1], pOVar9 = ON_SubDFace::Edge(this_01,local_178),
       papOVar19 = local_170, pOVar11 != pOVar9)) goto LAB_00617452;
  }
  pOVar2 = papOVar19[(&local_98)[lVar12].i][(&local_98)[lVar12].j];
  if (this_00 == pOVar2) goto LAB_00617452;
  if (((pOVar6->m_edge_count == 4) && (pOVar6->m_face_count == 4)) &&
     (bVar3 = ON_SubDVertex::IsSmoothOrDart(pOVar6), bVar3)) {
    if (this->m_bBoundaryCrease[lVar12] != false) goto LAB_00617ceb;
    if (this->m_bBoundaryCrease[(int)lVar12 - 1U & 3] == false) {
      uVar5 = 0;
      do {
        pOVar11 = ON_SubDVertex::Edge(pOVar6,uVar5);
        if (pOVar11 == (ON_SubDEdge *)0x0) goto LAB_00617452;
        if ((pOVar11->m_face_count != 2) ||
           ((bVar3 = ON_SubDEdge::IsSmooth(pOVar11), !bVar3 &&
            ((bVar3 = ON_SubDEdge::IsCrease(pOVar11), !bVar3 || (pOVar6->m_vertex_tag != Dart))))))
        {
          bVar3 = ON_SubDEdge::IsCrease(pOVar11);
          goto joined_r0x00617cce;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 4);
      if ((pOVar2 != (ON_SubDFace *)0x0) && (this_01 != pOVar2)) {
        iVar16 = (&local_d8)[lVar12].i;
        iVar20 = (&local_d8)[lVar12].j;
        uVar5 = ON_SubDFace::VertexIndex(pOVar2,pOVar6);
        if ((uVar5 != 0xffffffff) &&
           (uVar5 = ON_SubDFace::VertexIndex(pOVar2,pOVar6), uVar5 != 0xffffffff)) {
          pOVar6 = this->m_vertex_grid[iVar16][iVar20];
          if (pOVar2->m_edge_count == 4) {
            if (pOVar6 == (ON_SubDVertex *)0x0) goto LAB_00617452;
            pOVar6 = ON_SubDFace::Vertex(pOVar2,uVar5 & 3 ^ 2);
            bVar3 = pOVar6 == this->m_vertex_grid[iVar16][iVar20];
          }
          else {
            bVar3 = pOVar6 == (ON_SubDVertex *)0x0;
          }
joined_r0x00617cce:
          if (bVar3) goto LAB_00617ce3;
        }
      }
      goto LAB_00617452;
    }
  }
LAB_00617ce3:
  if (this->m_bBoundaryCrease[lVar12] == false) {
    lVar15 = 0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      pOVar6 = local_158[(int)lVar15 + (int)lVar12 & 3];
      pOVar11 = this->m_edge_grid[lVar12][lVar15];
      if ((pOVar6 != pOVar11->m_vertex[pOVar6 != pOVar11->m_vertex[0]]) ||
         (this->m_vertex_grid[(&local_78)[lVar12 * 2 + lVar15].i]
          [(&local_78)[lVar12 * 2 + lVar15].j] != pOVar11->m_vertex[pOVar6 == pOVar11->m_vertex[0]])
         ) goto LAB_00617452;
      lVar15 = 1;
      bVar3 = false;
    } while (bVar4);
  }
LAB_00617ceb:
  lVar12 = lVar12 + 1;
  if (lVar12 == 4) {
    return true;
  }
  goto LAB_0061788b;
  while( true ) {
    pOVar6 = local_158[uVar5 & 3];
    OVar7 = ON_SubDEdgePtr::EdgeDirection((ON_SubDEdgePtr *)((long)&local_f8[0].m_ptr + lVar15));
    lVar15 = lVar15 + 8;
    uVar5 = uVar5 + 1;
    if (pOVar6 != *(ON_SubDVertex **)(lVar12 + 0x80 + (1 - OVar7) * 8)) break;
LAB_00617797:
    if (lVar15 == 0x20) {
      lVar12 = 0;
      goto LAB_0061788b;
    }
    lVar12 = *(long *)((long)local_118 + lVar15);
    if (((((((lVar12 == 0) || (*(long *)(lVar12 + 0x80) == 0)) || (*(long *)(lVar12 + 0x88) == 0))
          || ((*(short *)(lVar12 + 100) == 0 ||
              (pOVar6 = *(ON_SubDVertex **)((long)local_158 + lVar15),
              pOVar6 == (ON_SubDVertex *)0x0)))) ||
         ((pOVar6->m_edge_count < 2 ||
          ((pOVar6->m_edges == (ON_SubDEdgePtr *)0x0 || (pOVar6->m_face_count == 0)))))) ||
        (pOVar6->m_faces == (ON_SubDFace **)0x0)) ||
       ((pOVar6 != this->m_vertex_grid[*(int *)((long)&local_138.i + lVar15)]
                   [*(int *)((long)&local_138.j + lVar15)] ||
        (lVar12 != *(long *)((long)this->m_center_edges + lVar15))))) break;
  }
LAB_00617452:
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDQuadNeighborhood::IsValid() const
{
  unsigned int count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExtraordinaryCornerVertex[i])
      count++;
  }
  if (count != m_extraordinary_corner_vertex_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bExactQuadrantPatch[i])
    {
      if (m_bExtraordinaryCornerVertex[i] )
        return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_exact_quadrant_patch_count)
    return ON_SUBD_RETURN_ERROR(false);

  count = 0;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (m_bBoundaryCrease[i])
    {
      //if ( m_bDartCrease[i] )
      //  return ON_SUBD_RETURN_ERROR(false);
      count++;
    }
  }
  if (count != m_boundary_crease_count)
    return ON_SUBD_RETURN_ERROR(false);

  //count = 0;
  //for (unsigned int i = 0; i < 4; i++)
  //{
  //  if (m_bDartCrease[i])
  //    count++;
  //}
  //if (count != m_dart_crease_count)
  //  return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDFace* quad_face = m_face_grid[1][1];
  if (nullptr == quad_face || 4 != quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  int quad_fvi0 = 0;
  int quad_dir = 0;
  {
    for (quad_fvi0 = 0; quad_fvi0 < 4; quad_fvi0++)
    {
      const ON_SubDVertex* v = quad_face->Vertex(quad_fvi0);
      if ( nullptr == v )
        return ON_SUBD_RETURN_ERROR(false);
      if (m_vertex_grid[1][1] == v)
      {
        v = quad_face->Vertex((quad_fvi0+1)%4);
        if ( nullptr == v )
          return ON_SUBD_RETURN_ERROR(false);
        if (m_vertex_grid[2][1] == v)
          quad_dir = 1;
        else if (m_vertex_grid[1][2] == v)
          quad_dir = -1;
        else
          return ON_SUBD_RETURN_ERROR(false);
        break;
      }
    }
    if (0 == quad_dir || quad_fvi0 >= 4)
      return ON_SUBD_RETURN_ERROR(false);
  }

  const ON_2dex face_corner_dex[4] = { { 0, 0 }, { 2, 0 }, { 2, 2 }, { 0, 2 } };
  const ON_2dex face_side_dex[4] = { { 1, 0 }, { 2, 1 }, { 1, 2 }, { 0, 1 } };

  const ON_2dex grid_quad_vertex_dex[4] = { { 1,1 }, { 2,1 }, { 2,2 }, { 1,2 } };
  const ON_2dex grid_corner_dex[4] = { { 0, 0 }, { 3, 0 }, { 3, 3 }, { 0, 3 } };
  const ON_2dex grid_side_dex[4][2] = { {{ 1, 0 }, { 2, 0 }}, {{ 3, 1 }, { 3, 2 }}, {{ 2, 3 }, { 1, 3 }}, {{ 0, 2 }, { 0, 1 }} };

  ON_2dex dex;

  const int fvi_map[4] = {
    quad_fvi0,
    (quad_fvi0+4+quad_dir)%4,
    (quad_fvi0+4+2*quad_dir)%4,
    (quad_fvi0+4+3*quad_dir)%4};

  const ON_SubDVertex* quad_vertex[4] = {
    quad_face->Vertex(fvi_map[0]), 
    quad_face->Vertex(fvi_map[1]),
    quad_face->Vertex(fvi_map[2]),
    quad_face->Vertex(fvi_map[3]) };

  const ON_SubDEdgePtr quad_eptr[4] = {
    quad_face->m_edge4[fvi_map[0]],
    quad_face->m_edge4[fvi_map[1]], 
    quad_face->m_edge4[fvi_map[2]],
    quad_face->m_edge4[fvi_map[3]] };

  const ON_SubDEdge* quad_edge[4] = {
    quad_eptr[0].Edge(),
    quad_eptr[1].Edge(),
    quad_eptr[2].Edge(),
    quad_eptr[3].Edge() };

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    if (nullptr == quad_edge[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_edge[fi]->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_edge[fi]->m_face_count < 1)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == quad_vertex[fi])
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_edge_count < 2 || nullptr == quad_vertex[fi]->m_edges )
      return ON_SUBD_RETURN_ERROR(false);
    if (quad_vertex[fi]->m_face_count < 1 || nullptr == quad_vertex[fi]->m_faces )
      return ON_SUBD_RETURN_ERROR(false);
    dex = grid_quad_vertex_dex[fi];
    if ( quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_edge[fi] != m_center_edges[fi] )
      return ON_SUBD_RETURN_ERROR(false);
    if ( quad_vertex[(fi+1)%4] != quad_edge[fi]->m_vertex[1-quad_eptr[fi].EdgeDirection()] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* side_face[4] = {};
  const ON_SubDFace* corner_face[4] = {};

  for (unsigned int fi = 0; fi < 4; fi++)
  {
    dex = grid_quad_vertex_dex[fi];
    if (quad_vertex[fi] != m_vertex_grid[dex.i][dex.j])
      return ON_SUBD_RETURN_ERROR(false);

    dex = face_side_dex[fi];
    side_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == side_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    if (m_bBoundaryCrease[fi])
    {
      // A tag of ON_SubDEdgeTag::SmoothX is an error here
      if ( false == quad_edge[fi]->IsCrease() )
        return ON_SUBD_RETURN_ERROR(false);

      if ( ON_UNSET_UINT_INDEX == quad_edge[fi]->FaceArrayIndex(quad_face) )
        return ON_SUBD_RETURN_ERROR(false);

      if (2 == quad_edge[fi]->m_face_count)
      {
        if ( false == quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
        if ( false == quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          return ON_SUBD_RETURN_ERROR(false);
      }

      if (nullptr != side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
    }
    else
    {
      if (nullptr == side_face[fi])
        return ON_SUBD_RETURN_ERROR(false);

      // A tag of ON_SubDEdgeTag::SmoothX is permitted here
      if ( 2 != quad_edge[fi]->m_face_count)
        return ON_SUBD_RETURN_ERROR(false);

      if (quad_edge[fi]->IsCrease())
      {
        unsigned int dart_count = 0;
        unsigned int crease_count = 0;
        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[0]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[0]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( ON_SubDVertexTag::Dart == quad_edge[fi]->m_vertex[1]->m_vertex_tag)
          dart_count++;
        else if ( quad_edge[fi]->m_vertex[1]->IsCreaseOrCorner())
          crease_count++;
        else
          return ON_SUBD_RETURN_ERROR(false);

        if ( 0 == dart_count )
          return ON_SUBD_RETURN_ERROR(false);

        if ( 2 != dart_count + crease_count )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (false == quad_edge[fi]->IsSmooth())
          return ON_SUBD_RETURN_ERROR(false);
      }
      const ON_SubDFace* edge_faces[2] = { ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(quad_edge[fi]->m_face2[1].m_ptr) };
      if (quad_face == edge_faces[0])
      {
        if (side_face[fi] != edge_faces[1])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else if (quad_face == edge_faces[1])
      {
        if (side_face[fi] != edge_faces[0])
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
        return ON_SUBD_RETURN_ERROR(false);

      if (nullptr == m_edge_grid[fi][0] || nullptr == m_edge_grid[fi][1])
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int side_fei[3] = {};
      side_fei[1] = side_face[fi]->EdgeArrayIndex(quad_edge[fi]);
      if ( ON_UNSET_UINT_INDEX == side_fei[1] )
        return ON_SUBD_RETURN_ERROR(false);

      const ON_SubDEdgePtr side_face_eptr = side_face[fi]->EdgePtr(side_fei[1]);
      if ( quad_edge[fi] != side_face_eptr.Edge())
        return ON_SUBD_RETURN_ERROR(false);

      unsigned int k = (side_face_eptr.EdgeDirection() == quad_eptr[fi].EdgeDirection()) ? 2 : 0;
      unsigned int side_face_edge_count = side_face[fi]->m_edge_count;
      side_fei[2-k] = (side_fei[1] + side_face_edge_count - 1) % side_face_edge_count;
      side_fei[k] = (side_fei[1] + 1) % side_face_edge_count;
      if ( m_edge_grid[fi][0] != side_face[fi]->Edge(side_fei[0]))
        return ON_SUBD_RETURN_ERROR(false);
      if ( m_edge_grid[fi][1] != side_face[fi]->Edge(side_fei[2]))
        return ON_SUBD_RETURN_ERROR(false);
    }

    dex = face_corner_dex[fi];
    corner_face[fi] = m_face_grid[dex.i][dex.j];
    if ( quad_face == corner_face[fi])
      return ON_SUBD_RETURN_ERROR(false);

    bool bCornerShouldExist 
      = 4 == quad_vertex[fi]->m_edge_count
      && 4 == quad_vertex[fi]->m_face_count
      && quad_vertex[fi]->IsSmoothOrDart()
      && false == m_bBoundaryCrease[fi]
      && false == m_bBoundaryCrease[(fi + 3) % 4];
    if (bCornerShouldExist)
    {
      for (unsigned int vei = 0; vei < 4; vei++)
      {
        const ON_SubDEdge* e = quad_vertex[fi]->Edge(vei);
        if ( nullptr == e)
          return ON_SUBD_RETURN_ERROR(false);
        if (2 == e->m_face_count)
        {
          if (e->IsSmooth())
            continue;
          if (e->IsCrease() && ON_SubDVertexTag::Dart == quad_vertex[fi]->m_vertex_tag)
            continue;
        }
        if (false == e->IsCrease())
          return ON_SUBD_RETURN_ERROR(false);
        bCornerShouldExist = false;
        break;
      }
    }

    dex = grid_corner_dex[fi];
    if (bCornerShouldExist)
    {
      if (nullptr == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (side_face[fi] == corner_face[fi])
        return ON_SUBD_RETURN_ERROR(false);
      if (ON_UNSET_UINT_INDEX == corner_face[fi]->VertexIndex(quad_vertex[fi]))
        return ON_SUBD_RETURN_ERROR(false);
      const unsigned int corner_face_vi = corner_face[fi]->VertexIndex(quad_vertex[fi]);
      if ( ON_UNSET_UINT_INDEX == corner_face_vi)
        return ON_SUBD_RETURN_ERROR(false);
      if (4 == corner_face[fi]->m_edge_count)
      {
        if (nullptr == m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
        if ( corner_face[fi]->Vertex((corner_face_vi+2)%4) != m_vertex_grid[dex.i][dex.j] )
          return ON_SUBD_RETURN_ERROR(false);
      }
      else
      {
        if (nullptr != m_vertex_grid[dex.i][dex.j])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
    //else 
    //{
    //  if (nullptr != corner_face[fi])
    //    return ON_SUBD_RETURN_ERROR(false);
    //  if (nullptr != m_vertex_grid[dex.i][dex.j])
    //    return ON_SUBD_RETURN_ERROR(false);
    //}

    if (false == m_bBoundaryCrease[fi])
    {
      for (unsigned int j = 0; j < 2; j++)
      {
        const ON_SubDVertex* v = quad_vertex[(fi + j) % 4];
        unsigned int k = (v != m_edge_grid[fi][j]->m_vertex[0]) ? 0 : 1;
        if (v != m_edge_grid[fi][j]->m_vertex[1 - k])
          return ON_SUBD_RETURN_ERROR(false);
        dex = grid_side_dex[fi][j];
        if (m_vertex_grid[dex.i][dex.j] != m_edge_grid[fi][j]->m_vertex[k])
          return ON_SUBD_RETURN_ERROR(false);
      }
    }
  }

  return true;
}